

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nick.cpp
# Opt level: O3

void __thiscall Enterprise::Nick::run_for(Nick *this,Cycles duration)

{
  uint16_t *puVar1;
  long lVar2;
  bool bVar3;
  uint8_t *puVar4;
  ScanTarget *pSVar5;
  short sVar6;
  uint8_t uVar7;
  uint16_t uVar8;
  Mode MVar9;
  uint uVar10;
  OutputType OVar11;
  WrappedInt<Cycles> WVar12;
  long lVar13;
  undefined4 extraout_var;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  uint16_t *puVar17;
  long lVar18;
  int iVar19;
  byte bVar20;
  uint16_t *target;
  int iVar21;
  int iVar22;
  long lVar23;
  ulong uVar24;
  int iVar25;
  WrappedInt<Cycles> WVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  long lVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  
  if (duration.super_WrappedInt<Cycles>.length_ != 0) {
    WVar12.length_ = 0x7fffffff;
    if ((long)duration.super_WrappedInt<Cycles>.length_ < 0x7fffffff) {
      WVar12 = duration.super_WrappedInt<Cycles>.length_;
    }
    WVar26.length_ = 0xffffffff80000000;
    if (-0x80000000 < WVar12.length_) {
      WVar26.length_ = WVar12.length_;
    }
    puVar1 = this->palette_;
    uVar10 = this->horizontal_counter_;
    do {
      iVar25 = (int)WVar26.length_;
      iVar27 = 0x390 - uVar10;
      if (iVar25 <= (int)(0x390 - uVar10)) {
        iVar27 = iVar25;
      }
      iVar19 = (int)uVar10 >> 4;
      iVar21 = (int)(iVar27 + uVar10) >> 4;
      uVar15 = (int)(iVar27 + uVar10) % 0x390;
      this->horizontal_counter_ = uVar15;
      if (iVar19 != iVar21) {
        if (uVar10 < 0x10) {
          set_output_type(this,Sync,false);
          if (this->left_margin_ == 0) {
            this->is_sync_or_pixels_ = true;
          }
          if (this->right_margin_ == 0) {
            this->is_sync_or_pixels_ = false;
          }
        }
        this->last_read_ = 0xff;
        iVar29 = 4;
        if (iVar21 < 4) {
          iVar29 = iVar21;
        }
        iVar28 = iVar19;
        if (iVar19 < iVar29) {
          bVar3 = this->should_reload_line_parameters_;
          puVar4 = this->ram_;
          uVar14 = (ulong)this->line_parameter_pointer_;
          iVar22 = iVar19;
          do {
            if (bVar3 == false) goto switchD_0033d4cc_default;
            switch(iVar22) {
            case 0:
              this->lines_remaining_ = puVar4[uVar14];
              bVar20 = puVar4[uVar14 + 1];
              this->last_read_ = bVar20;
              this->interrupt_line_ = (bool)(bVar20 >> 7);
              MVar9 = puVar4[uVar14 + 1] >> 1 & LPixel;
              this->mode_ = MVar9;
              bVar20 = puVar4[uVar14 + 1] >> 5 & 3;
              iVar28 = 1 << bVar20;
              this->bpp_ = iVar28;
              if (MVar9 - CH256 < 3) {
LAB_0033d535:
                uVar10 = (uint)(byte)(8 / (byte)iVar28);
                uVar31 = 1;
                uVar32 = 0;
              }
              else if (MVar9 == Attr) {
                uVar10 = 8;
                uVar31 = 1;
                uVar32 = 1;
              }
              else {
                if (MVar9 == LPixel) goto LAB_0033d535;
                uVar10 = 0x10 >> bVar20;
                uVar31 = 2;
                uVar32 = 0;
              }
              this->column_size_ = uVar10;
              *(ulong *)this->line_data_per_column_increments_ = CONCAT44(uVar32,uVar31);
              this->vres_ = (bool)(puVar4[uVar14 + 1] >> 4 & 1);
              this->reload_line_parameter_pointer_ = (bool)(puVar4[uVar14 + 1] & 1);
              break;
            case 1:
              this->left_margin_ = puVar4[uVar14 + 2] & 0x3f;
              this->right_margin_ = puVar4[uVar14 + 3] & 0x3f;
              bVar20 = puVar4[uVar14 + 3];
              this->last_read_ = bVar20;
              MVar9 = this->mode_;
              if (MVar9 - CH256 < 3) {
                this->alt_ind_palettes[0] = puVar1;
                uVar10 = (uint)(bVar20 >> 4);
                puVar17 = (uint16_t *)((ulong)(uVar10 & 4) + (long)puVar1);
                this->alt_ind_palettes[2] = puVar17;
                uVar10 = uVar10 & 0xfffffff8;
              }
              else {
                if ((MVar9 != LPixel) && (MVar9 != Pixel)) break;
                bVar20 = -((char)puVar4[uVar14 + 2] >> 7);
                uVar10 = puVar4[uVar14 + 2] & 0x40;
                this->two_colour_mask_ = ~(bVar20 + (char)uVar10 * '\x02');
                this->alt_ind_palettes[0] = puVar1;
                puVar17 = puVar1 + (ulong)bVar20 * 2;
                this->alt_ind_palettes[2] = puVar17;
                uVar10 = uVar10 >> 3;
              }
              this->alt_ind_palettes[1] = (uint16_t *)((long)puVar1 + (ulong)uVar10);
              this->alt_ind_palettes[3] = (uint16_t *)((long)puVar17 + (ulong)uVar10);
              break;
            case 2:
              bVar20 = puVar4[uVar14 + 4];
              this->start_line_data_pointer_[0] = (ushort)bVar20;
              uVar8 = CONCAT11(puVar4[uVar14 + 5],bVar20);
              this->start_line_data_pointer_[0] = uVar8;
              this->line_data_pointer_[0] = uVar8;
              uVar7 = puVar4[uVar14 + 5];
              goto LAB_0033d5cf;
            case 3:
              bVar20 = puVar4[uVar14 + 6];
              this->start_line_data_pointer_[1] = (ushort)bVar20;
              uVar8 = CONCAT11(puVar4[uVar14 + 7],bVar20);
              this->start_line_data_pointer_[1] = uVar8;
              this->line_data_pointer_[1] = uVar8;
              uVar7 = puVar4[uVar14 + 7];
LAB_0033d5cf:
              this->last_read_ = uVar7;
            }
switchD_0033d4cc_default:
            this->output_duration_ = this->output_duration_ + 1;
            this->line_data_pointer_[0] =
                 this->line_data_pointer_[0] +
                 (short)this->line_data_per_column_increments_[0] * (ushort)this->is_sync_or_pixels_
            ;
            this->line_data_pointer_[1] =
                 this->line_data_pointer_[1] +
                 (ushort)this->is_sync_or_pixels_ * (short)this->line_data_per_column_increments_[1]
            ;
            iVar22 = iVar22 + 1;
            if (iVar22 == this->left_margin_) {
              this->is_sync_or_pixels_ = true;
            }
            if (iVar22 == this->right_margin_) {
              this->is_sync_or_pixels_ = false;
            }
            iVar28 = iVar29;
          } while (iVar29 != iVar22);
        }
        if (iVar28 == 4) {
          OVar11 = this->is_sync_or_pixels_ ^ Blank;
          if (this->mode_ != Vsync) {
            OVar11 = Blank;
          }
          set_output_type(this,OVar11,false);
        }
        if (this->mode_ == Vsync) {
          if (3 < iVar28) {
            while (iVar28 < iVar21) {
              iVar19 = this->left_margin_;
              iVar29 = iVar21;
              if (iVar19 < iVar21) {
                iVar29 = iVar19;
              }
              if (iVar19 <= iVar28) {
                iVar29 = iVar21;
              }
              iVar22 = this->right_margin_;
              iVar16 = iVar22;
              if (iVar29 <= iVar22) {
                iVar16 = iVar29;
              }
              if (iVar28 < iVar22) {
                iVar29 = iVar16;
              }
              this->output_duration_ = this->output_duration_ + (iVar29 - iVar28);
              bVar20 = this->is_sync_or_pixels_;
              sVar6 = (short)(iVar29 - iVar28) * (ushort)bVar20;
              this->line_data_pointer_[0] =
                   this->line_data_pointer_[0] +
                   (short)this->line_data_per_column_increments_[0] * sVar6;
              this->line_data_pointer_[1] =
                   this->line_data_pointer_[1] +
                   sVar6 * (short)this->line_data_per_column_increments_[1];
              if ((iVar29 == iVar19 || iVar29 == iVar22) && iVar29 != 0x39) {
                bVar20 = iVar29 == 0x39 || iVar29 != iVar22;
                this->is_sync_or_pixels_ = (bool)bVar20;
              }
              set_output_type(this,(uint)(bVar20 ^ 1),false);
              iVar28 = iVar29;
            }
          }
        }
        else {
          iVar29 = this->first_pixel_window_;
          bVar3 = iVar28 < iVar29;
          if (iVar28 < iVar21 && iVar28 < iVar29) {
            lVar13 = (long)iVar21;
            lVar30 = 4;
            if (lVar13 < 4) {
              lVar30 = lVar13;
            }
            if (lVar30 <= iVar19) {
              lVar30 = (long)iVar19;
            }
            uVar14 = lVar30 * 2;
            uVar24 = uVar14 & 0xffffffff;
            lVar23 = 0;
            do {
              lVar2 = lVar30 + lVar23;
              if (lVar2 == 6) {
                set_output_type(this,ColourBurst,false);
              }
              if ((lVar2 < 8) && (this->should_reload_line_parameters_ != false)) {
                if (0xe < (int)uVar24) {
                  __assert_fail("base < 7",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Enterprise/Nick.cpp"
                                ,0x131,"void Enterprise::Nick::run_for(Cycles)");
                }
                puVar4 = this->ram_;
                uVar8 = anon_unknown.dwarf_c68e8f::mapped_colour
                                  (puVar4[lVar23 * 2 + uVar14 + this->line_parameter_pointer_]);
                *(uint16_t *)(this->line_data_per_column_increments_ + lVar30 + lVar23 + 5) = uVar8;
                uVar8 = anon_unknown.dwarf_c68e8f::mapped_colour
                                  (puVar4[lVar23 * 2 + uVar14 + this->line_parameter_pointer_ + 1]);
                *(uint16_t *)
                 ((long)this->line_data_per_column_increments_ + lVar23 * 4 + lVar30 * 4 + 0x16) =
                     uVar8;
                this->last_read_ = puVar4[lVar23 * 2 + uVar14 + this->line_parameter_pointer_ + 1];
              }
              this->output_duration_ = this->output_duration_ + 1;
              this->line_data_pointer_[0] =
                   this->line_data_pointer_[0] +
                   (short)this->line_data_per_column_increments_[0] *
                   (ushort)this->is_sync_or_pixels_;
              this->line_data_pointer_[1] =
                   this->line_data_pointer_[1] +
                   (ushort)this->is_sync_or_pixels_ *
                   (short)this->line_data_per_column_increments_[1];
              lVar18 = lVar30 + lVar23 + 1;
              if ((lVar2 != 0x38) && ((int)lVar18 == this->left_margin_)) {
                this->is_sync_or_pixels_ = true;
              }
              if ((lVar2 != 0x38) && ((int)lVar18 == this->right_margin_)) {
                this->is_sync_or_pixels_ = false;
              }
              iVar29 = this->first_pixel_window_;
              bVar3 = lVar18 < iVar29;
              lVar23 = lVar23 + 1;
            } while ((lVar18 < lVar13) && (uVar24 = (ulong)((int)uVar24 + 2), lVar18 < iVar29));
            iVar28 = (int)lVar30 + (int)lVar23;
          }
          if (!bVar3) {
            if (iVar28 == iVar29) {
              set_output_type(this,this->is_sync_or_pixels_ ^ Border,false);
            }
            while (iVar28 < iVar21) {
              iVar19 = this->left_margin_;
              iVar29 = iVar21;
              if (iVar19 < iVar21) {
                iVar29 = iVar19;
              }
              iVar22 = this->right_margin_;
              if (iVar19 <= iVar28) {
                iVar29 = iVar21;
              }
              iVar16 = iVar29;
              if (iVar22 < iVar29) {
                iVar16 = iVar22;
              }
              if (iVar22 <= iVar28) {
                iVar16 = iVar29;
              }
              bVar3 = this->is_sync_or_pixels_;
              OVar11 = (OutputType)bVar3;
              iVar29 = iVar16 - iVar28;
              if (bVar3 == true) {
                for (; iVar29 != 0; iVar29 = iVar29 - iVar19) {
                  if (this->pixel_pointer_ == (uint16_t *)0x0) {
                    if (this->output_duration_ != 0) {
                      set_output_type(this,Pixels,true);
                    }
                    pSVar5 = (this->crt_).scan_target_;
                    iVar19 = (*pSVar5->_vptr_ScanTarget[5])(pSVar5,0x150,1);
                    puVar17 = (uint16_t *)CONCAT44(extraout_var,iVar19);
                    (this->crt_).allocated_data_length_ =
                         -(ulong)(puVar17 == (uint16_t *)0x0) | 0x150;
                    this->allocated_pointer_ = puVar17;
                    this->pixel_pointer_ = puVar17;
                    target = puVar17;
                  }
                  else {
                    puVar17 = this->allocated_pointer_;
                    target = this->pixel_pointer_;
                  }
                  if (puVar17 == (uint16_t *)0x0) {
                    this->output_duration_ = this->output_duration_ + iVar29;
                    OVar11 = (OutputType)this->is_sync_or_pixels_;
                    sVar6 = (ushort)this->is_sync_or_pixels_ * (short)iVar29;
                    this->line_data_pointer_[0] =
                         this->line_data_pointer_[0] +
                         (short)this->line_data_per_column_increments_[0] * sVar6;
                    this->line_data_pointer_[1] =
                         this->line_data_pointer_[1] +
                         sVar6 * (short)this->line_data_per_column_increments_[1];
                    iVar22 = iVar28 + iVar29;
                    if ((iVar22 != 0x39) && (iVar22 == this->left_margin_)) {
                      this->is_sync_or_pixels_ = true;
                      OVar11 = Blank;
                    }
                    iVar28 = iVar22;
                    if ((iVar22 != 0x39) && (iVar22 == this->right_margin_)) goto LAB_0033dce2;
                    break;
                  }
                  uVar14 = (ulong)((long)puVar17 + (0x2a0 - (long)target)) >> 1;
                  iVar19 = (int)((long)((ulong)(uint)((int)uVar14 >> 0x1f) << 0x20 |
                                       uVar14 & 0xffffffff) / (long)this->column_size_);
                  if (iVar29 <= iVar19) {
                    iVar19 = iVar29;
                  }
                  iVar22 = this->bpp_;
                  switch(this->mode_) {
                  case Attr:
                    if (iVar22 == 2) {
                      output_attributed<2>(this,target,iVar19);
                    }
                    else if (iVar22 == 4) {
                      output_attributed<4>(this,target,iVar19);
                    }
                    else if (iVar22 == 8) {
                      output_attributed<8>(this,target,iVar19);
                    }
                    else {
                      output_attributed<1>(this,target,iVar19);
                    }
                    break;
                  case CH256:
                    if (iVar22 == 2) {
                      output_character<2,8>(this,target,iVar19);
                    }
                    else if (iVar22 == 4) {
                      output_character<4,8>(this,target,iVar19);
                    }
                    else if (iVar22 == 8) {
                      output_character<8,8>(this,target,iVar19);
                    }
                    else {
                      output_character<1,8>(this,target,iVar19);
                    }
                    break;
                  case CH128:
                    if (iVar22 == 2) {
                      output_character<2,7>(this,target,iVar19);
                    }
                    else if (iVar22 == 4) {
                      output_character<4,7>(this,target,iVar19);
                    }
                    else if (iVar22 == 8) {
                      output_character<8,7>(this,target,iVar19);
                    }
                    else {
                      output_character<1,7>(this,target,iVar19);
                    }
                    break;
                  case CH64:
                    if (iVar22 == 2) {
                      output_character<2,6>(this,target,iVar19);
                    }
                    else if (iVar22 == 4) {
                      output_character<4,6>(this,target,iVar19);
                    }
                    else if (iVar22 == 8) {
                      output_character<8,6>(this,target,iVar19);
                    }
                    else {
                      output_character<1,6>(this,target,iVar19);
                    }
                    break;
                  default:
                    if (iVar22 == 2) {
                      output_pixel<2,false>(this,target,iVar19);
                    }
                    else if (iVar22 == 4) {
                      output_pixel<4,false>(this,target,iVar19);
                    }
                    else if (iVar22 == 8) {
                      output_pixel<8,false>(this,target,iVar19);
                    }
                    else {
                      output_pixel<1,false>(this,target,iVar19);
                    }
                    break;
                  case LPixel:
                    if (iVar22 == 2) {
                      output_pixel<2,true>(this,target,iVar19);
                    }
                    else if (iVar22 == 4) {
                      output_pixel<4,true>(this,target,iVar19);
                    }
                    else if (iVar22 == 8) {
                      output_pixel<8,true>(this,target,iVar19);
                    }
                    else {
                      output_pixel<1,true>(this,target,iVar19);
                    }
                  }
                  puVar17 = this->pixel_pointer_;
                  this->pixel_pointer_ = puVar17 + (long)iVar19 * (long)this->column_size_;
                  this->output_duration_ = this->output_duration_ + iVar19;
                  if ((long)(puVar17 + (long)iVar19 * (long)this->column_size_) -
                      (long)this->allocated_pointer_ == 0x2a0) {
                    set_output_type(this,Pixels,true);
                  }
                  OVar11 = (OutputType)this->is_sync_or_pixels_;
                  sVar6 = (ushort)this->is_sync_or_pixels_ * (short)iVar19;
                  this->line_data_pointer_[0] =
                       this->line_data_pointer_[0] +
                       (short)this->line_data_per_column_increments_[0] * sVar6;
                  this->line_data_pointer_[1] =
                       this->line_data_pointer_[1] +
                       sVar6 * (short)this->line_data_per_column_increments_[1];
                  iVar28 = iVar28 + iVar19;
                  if ((iVar28 != 0x39) && (iVar28 == this->left_margin_)) {
                    this->is_sync_or_pixels_ = true;
                    OVar11 = Blank;
                  }
                  if ((iVar28 != 0x39) && (iVar28 == this->right_margin_)) {
                    this->is_sync_or_pixels_ = false;
                    OVar11 = Sync;
                  }
                }
              }
              else {
                this->output_duration_ = this->output_duration_ + iVar29;
                sVar6 = (ushort)bVar3 * (short)iVar29;
                this->line_data_pointer_[0] =
                     this->line_data_pointer_[0] +
                     (short)this->line_data_per_column_increments_[0] * sVar6;
                this->line_data_pointer_[1] =
                     this->line_data_pointer_[1] +
                     sVar6 * (short)this->line_data_per_column_increments_[1];
                if (iVar16 == iVar19 && iVar16 != 0x39) {
                  this->is_sync_or_pixels_ = true;
                  OVar11 = Blank;
                }
                else {
                  iVar28 = 0x39;
                  if (iVar16 == 0x39) goto LAB_0033dcee;
                }
                iVar28 = iVar16;
                if (iVar16 == iVar22) {
LAB_0033dce2:
                  this->is_sync_or_pixels_ = false;
                  OVar11 = Sync;
                  iVar28 = iVar22;
                }
              }
LAB_0033dcee:
              set_output_type(this,OVar11 ^ Border,false);
            }
          }
        }
        uVar15 = this->horizontal_counter_;
        if (this->horizontal_counter_ == 0) {
          if (iVar28 != 0x39) {
            __assert_fail("window == 57",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Enterprise/Nick.cpp"
                          ,0x18e,"void Enterprise::Nick::run_for(Cycles)");
          }
          puVar4 = &this->lines_remaining_;
          *puVar4 = *puVar4 + '\x01';
          if (*puVar4 == '\0') {
            this->should_reload_line_parameters_ = true;
            if (this->reload_line_parameter_pointer_ == true) {
              this->line_parameter_pointer_ = this->line_parameter_base_;
            }
            else {
              this->line_parameter_pointer_ = this->line_parameter_pointer_ + 0x10;
            }
          }
          else {
            this->should_reload_line_parameters_ = false;
          }
          MVar9 = this->mode_;
          uVar10 = 0;
          uVar15 = 0;
          if (MVar9 < 8) {
            uVar15 = uVar10;
            if ((0x38U >> (MVar9 & 0x1f) & 1) == 0) {
              if (((0x86U >> (MVar9 & 0x1f) & 1) != 0) && (this->vres_ == false)) {
                this->line_data_pointer_[0] = this->start_line_data_pointer_[0];
              }
            }
            else {
              this->line_data_pointer_[0] = this->start_line_data_pointer_[0];
              this->line_data_pointer_[1] = this->line_data_pointer_[1] + 1;
            }
          }
        }
      }
      uVar10 = uVar15;
      WVar26.length_ = (IntType)(uint)(iVar25 - iVar27);
    } while (iVar25 - iVar27 != 0);
  }
  return;
}

Assistant:

void Nick::run_for(Cycles duration) {
	constexpr int line_length = 912;

#define add_window(x)															\
	line_data_pointer_[0] += is_sync_or_pixels_ * line_data_per_column_increments_[0] * (x);	\
	line_data_pointer_[1] += is_sync_or_pixels_ * line_data_per_column_increments_[1] * (x);	\
	window += x;																\
	if(window != 57 && window == left_margin_) is_sync_or_pixels_ = true;		\
	if(window != 57 && window == right_margin_) is_sync_or_pixels_ = false;

	int clocks_remaining = duration.as<int>();
	while(clocks_remaining) {
		// Determine how many cycles are left this line.
		const int clocks_this_line = std::min(clocks_remaining, line_length - horizontal_counter_);

		// Convert that into a [start/current] and end window.
		int window = horizontal_counter_ >> 4;
		const int end_window = (horizontal_counter_ + clocks_this_line) >> 4;

		// Advance the line counters.
		clocks_remaining -= clocks_this_line;
		horizontal_counter_ = (horizontal_counter_ + clocks_this_line) % line_length;

		// Do nothing if a window boundary isn't crossed.
		if(window == end_window) continue;

		// HSYNC is signalled for four windows at the start of the line.
		// I currently believe this happens regardless of Vsync mode.
		if(!window) {
			set_output_type(OutputType::Sync);

			// There's no increment to get to 0, it happens when the horizontal_counter_
			// is reset. So test for active bit effect manually.
			if(!left_margin_) is_sync_or_pixels_ = true;
			if(!right_margin_) is_sync_or_pixels_ = false;
		}

		// Default to noting read.
		last_read_ = 0xff;

		while(window < 4 && window < end_window) {
			if(should_reload_line_parameters_) {
				switch(window) {
					// First slot: line count, mode and interrupt flag.
					case 0:
						// Byte 0: lines remaining.
						lines_remaining_ = ram_[line_parameter_pointer_];

						// Byte 1: current interrupt output plus graphics modes...
						last_read_ = ram_[line_parameter_pointer_ + 1];

						// Set the new interrupt line output.
						interrupt_line_ = ram_[line_parameter_pointer_ + 1] & 0x80;

						// Determine the mode and depth, and hence the column size.
						mode_ = Mode((ram_[line_parameter_pointer_ + 1] >> 1)&7);
						bpp_ = 1 << ((ram_[line_parameter_pointer_ + 1] >> 5)&3);
						switch(mode_) {
							default:
							case Mode::Pixel:
								column_size_ = 16 / bpp_;
								line_data_per_column_increments_[0] = 2;
								line_data_per_column_increments_[1] = 0;
							break;

							case Mode::LPixel:
							case Mode::CH64:
							case Mode::CH128:
							case Mode::CH256:
								column_size_ = 8 / bpp_;
								line_data_per_column_increments_[0] = 1;
								line_data_per_column_increments_[1] = 0;
							break;

							case Mode::Attr:
								column_size_ = 8;
								line_data_per_column_increments_[0] = 1;
								line_data_per_column_increments_[1] = 1;
							break;
						}

						vres_ = ram_[line_parameter_pointer_ + 1] & 0x10;
						reload_line_parameter_pointer_ = ram_[line_parameter_pointer_ + 1] & 0x01;
					break;

					// Second slot: margins and ALT/IND bits.
					case 1:
						// Determine the margins.
						left_margin_ = ram_[line_parameter_pointer_ + 2] & 0x3f;
						right_margin_ = ram_[line_parameter_pointer_ + 3] & 0x3f;
						last_read_ = ram_[line_parameter_pointer_ + 3];

						// Set up the alternative palettes,
						switch(mode_) {
							default:
							break;

							// NB: LSBALT/MSBALT and ALTIND0/ALTIND1 appear to have opposite effects on palette selection.

							case Mode::Pixel:
							case Mode::LPixel: {
								const uint8_t flags = ram_[line_parameter_pointer_ + 2];

								// Use MSBALT and LSBALT to pick the alt_ind_palettes.
								//
								// LSBALT = b6 of params[2], if set => character codes with bit 6 set should use palette indices 4... instead of 0... .
								// MSBALT = b7 of params[2], if set => character codes with bit 7 set should use palette indices 2 and 3.
								two_colour_mask_ = 0xff &~ (((flags&0x80) >> 7) | ((flags&0x40) << 1));

								alt_ind_palettes[0] = palette_;
								alt_ind_palettes[2] = alt_ind_palettes[0] + ((flags & 0x80) ? 2 : 0);

								alt_ind_palettes[1] = alt_ind_palettes[0] + ((flags & 0x40) ? 4 : 0);
								alt_ind_palettes[3] = alt_ind_palettes[2] + ((flags & 0x40) ? 4 : 0);
							} break;

							case Mode::CH64:
							case Mode::CH128:
							case Mode::CH256: {
								const uint8_t flags = ram_[line_parameter_pointer_ + 3];

								// Use ALTIND0 and ALTIND1 to pick the alt_ind_palettes.
								//
								// ALTIND1 = b6 of params[3], if set => character codes with bit 7 set should use palette indices 2 and 3.
								// ALTIND0 = b7 of params[3], if set => character codes with bit 6 set should use palette indices 4... instead of 0... .
								alt_ind_palettes[0] = palette_;
								alt_ind_palettes[2] = alt_ind_palettes[0] + ((flags & 0x40) ? 2 : 0);

								alt_ind_palettes[1] = alt_ind_palettes[0] + ((flags & 0x80) ? 4 : 0);
								alt_ind_palettes[3] = alt_ind_palettes[2] + ((flags & 0x80) ? 4 : 0);
							} break;
						}
					break;

					// Third slot: Line data pointer 1.
					case 2:
						start_line_data_pointer_[0] = ram_[line_parameter_pointer_ + 4];
						start_line_data_pointer_[0] |= ram_[line_parameter_pointer_ + 5] << 8;

						line_data_pointer_[0] = start_line_data_pointer_[0];
						last_read_ = ram_[line_parameter_pointer_ + 5];
					break;

					// Fourth slot: Line data pointer 2.
					case 3:
						start_line_data_pointer_[1] = ram_[line_parameter_pointer_ + 6];
						start_line_data_pointer_[1] |= ram_[line_parameter_pointer_ + 7] << 8;

						line_data_pointer_[1] = start_line_data_pointer_[1];
						last_read_ = ram_[line_parameter_pointer_ + 7];
					break;
				}
			}

			++output_duration_;
			add_window(1);
		}
		if(window == 4) {
			if(mode_ == Mode::Vsync) {
				set_output_type(is_sync_or_pixels_ ? OutputType::Sync : OutputType::Blank);
			} else {
				set_output_type(OutputType::Blank);
			}
		}

		// Deal with vsync mode out here.
		if(mode_ == Mode::Vsync) {
			if(window >= 4) {
				while(window < end_window) {
					// Skip straight to the next event.
					int next_event = end_window;
					if(window < left_margin_) next_event = std::min(next_event, left_margin_);
					if(window < right_margin_) next_event = std::min(next_event, right_margin_);

					output_duration_ += next_event - window;
					add_window(next_event - window);
					set_output_type(is_sync_or_pixels_ ? OutputType::Sync : OutputType::Blank);
				}
			}
		} else {
			// If present then the colour burst is output for the period from
			// the start of window 6 to the end of window 10.
			//
			// The first 8 palette entries also need to be fetched here.
			while(window < first_pixel_window_ && window < end_window) {
				if(window == 6) {
					set_output_type(OutputType::ColourBurst);
				}

				if(should_reload_line_parameters_ && window < 8) {
					const int base = (window - 4) << 1;
					assert(base < 7);
					palette_[base] = mapped_colour(ram_[line_parameter_pointer_ + base + 8]);
					palette_[base + 1] = mapped_colour(ram_[line_parameter_pointer_ + base + 9]);
					last_read_ = ram_[line_parameter_pointer_ + base + 9];
				}

				++output_duration_;
				add_window(1);
			}

			if(window >= first_pixel_window_) {
				if(window == first_pixel_window_) {
					set_output_type(is_sync_or_pixels_ ? OutputType::Pixels : OutputType::Border);
				}

				while(window < end_window) {
					int next_event = end_window;
					if(window < left_margin_) next_event = std::min(next_event, left_margin_);
					if(window < right_margin_) next_event = std::min(next_event, right_margin_);

					if(is_sync_or_pixels_) {

#define DispatchBpp(func) \
	switch(bpp_) {	\
		default:	\
		case 1: func(1)(pixel_pointer_, output_duration);	break;	\
		case 2: func(2)(pixel_pointer_, output_duration);	break;	\
		case 4: func(4)(pixel_pointer_, output_duration);	break;	\
		case 8: func(8)(pixel_pointer_, output_duration);	break;	\
	}

#define pixel(x) output_pixel<x, false>
#define lpixel(x) output_pixel<x, true>
#define ch256(x) output_character<x, 8>
#define ch128(x) output_character<x, 7>
#define ch64(x) output_character<x, 6>
#define attr(x) output_attributed<x>

						int columns_remaining = next_event - window;
						while(columns_remaining) {
							if(!pixel_pointer_) {
								if(output_duration_) {
									set_output_type(OutputType::Pixels, true);
								}
								pixel_pointer_ = allocated_pointer_ = reinterpret_cast<uint16_t *>(crt_.begin_data(allocation_size));
							}

							if(allocated_pointer_) {
								const int output_duration = std::min(columns_remaining, int(allocated_pointer_ + allocation_size - pixel_pointer_) / column_size_);

								switch(mode_) {
									default:
									case Mode::Pixel:	DispatchBpp(pixel);		break;
									case Mode::LPixel:	DispatchBpp(lpixel);	break;
									case Mode::CH256:	DispatchBpp(ch256);		break;
									case Mode::CH128:	DispatchBpp(ch128);		break;
									case Mode::CH64:	DispatchBpp(ch64);		break;
									case Mode::Attr:	DispatchBpp(attr);		break;
								}

								pixel_pointer_ += output_duration * column_size_;
								output_duration_ += output_duration;
								if(pixel_pointer_ - allocated_pointer_ == allocation_size) {
									set_output_type(OutputType::Pixels, true);
								}
								columns_remaining -= output_duration;
								add_window(output_duration);
							} else {
								output_duration_ += columns_remaining;
								add_window(columns_remaining);
								columns_remaining = 0;
							}
						}

#undef attr
#undef ch64
#undef ch128
#undef ch256
#undef pixel
#undef lpixel
#undef DispatchBpp
					} else {
						output_duration_ += next_event - window;
						add_window(next_event - window);
					}

					set_output_type(is_sync_or_pixels_ ? OutputType::Pixels : OutputType::Border);
				}
			}
		}

		// Check for end of line.
		if(!horizontal_counter_) {
			assert(window == 57);

			++lines_remaining_;
			if(!lines_remaining_) {
				should_reload_line_parameters_ = true;

				// Check for end-of-frame.
				if(reload_line_parameter_pointer_) {
					line_parameter_pointer_ = line_parameter_base_;
				} else {
					line_parameter_pointer_ += 16;
				}
			} else {
				should_reload_line_parameters_ = false;
			}

			// Deal with VRES and other address reloading, dependant upon mode.
			switch(mode_) {
				default: break;
				case Mode::CH64:
				case Mode::CH128:
				case Mode::CH256:
					line_data_pointer_[0] = start_line_data_pointer_[0];
					++line_data_pointer_[1];
				break;

				case Mode::Pixel:
				case Mode::LPixel:
				case Mode::Attr:
					// Reload the pixel or attribute address if VRES is clear.
					if(!vres_) {
						line_data_pointer_[0] = start_line_data_pointer_[0];
					}
				break;
			}
		}
	}

#undef add_window

}